

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Buffer::remove_samples(Blip_Buffer *this,long count)

{
  long lVar1;
  size_t __n;
  buf_t_ *__dest;
  ulong uVar2;
  
  if (this->buffer_ == (buf_t_ *)0x0) {
    __assert_fail("( \"unmet requirement\", buffer_ )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Blip_Buffer.cpp"
                  ,0x139,"void Blip_Buffer::remove_samples(long)");
  }
  if (count != 0) {
    remove_silence(this,count);
    __dest = this->buffer_;
    uVar2 = this->offset_ >> 0x10;
    lVar1 = uVar2 + 0x19;
    __n = uVar2 * 2 + 0x32;
    if (count < lVar1) {
      memcpy(__dest,__dest + count,__n);
    }
    else {
      memmove(__dest,__dest + count,__n);
    }
    memset(this->buffer_ + lVar1,0x7f,count * 2);
    return;
  }
  return;
}

Assistant:

void Blip_Buffer::remove_samples( long count )
{
	require( buffer_ ); // sample rate must have been set
	
	if ( !count ) // optimization
		return;
	
	remove_silence( count );
	
	// Allows synthesis slightly past time passed to end_frame(), as long as it's
	// not more than an output sample.
	// to do: kind of hacky, could add run_until() which keeps track of extra synthesis
	int const copy_extra = 1;
	
	// copy remaining samples to beginning and clear old samples
	long remain = samples_avail() + widest_impulse_ + copy_extra;
	if ( count >= remain )
		memmove( buffer_, buffer_ + count, remain * sizeof (buf_t_) );
	else
		memcpy(  buffer_, buffer_ + count, remain * sizeof (buf_t_) );
	memset( buffer_ + remain, sample_offset & 0xFF, count * sizeof (buf_t_) );
}